

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

char * rv_alloc(int i)

{
  Bigint *pBVar1;
  char *pcVar2;
  int iVar3;
  int k;
  
  k = 0;
  if (0x1b < (uint)i) {
    iVar3 = 4;
    k = 0;
    do {
      k = k + 1;
      iVar3 = iVar3 * 2;
    } while ((long)iVar3 + 0x18U <= (ulong)(uint)i);
  }
  pBVar1 = Balloc(k);
  if (pBVar1 == (Bigint *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    *(int *)&pBVar1->next = k;
    pcVar2 = (char *)((long)&pBVar1->next + 4);
  }
  return pcVar2;
}

Assistant:

static char *
rv_alloc(int i)
{
    int j, k, *r;

    j = sizeof(ULong);
    for(k = 0;
        sizeof(Bigint) - sizeof(ULong) - sizeof(int) + j <= (unsigned)i;
        j <<= 1)
        k++;
    r = (int*)Balloc(k);
    if (r == NULL)
        return NULL;
    *r = k;
    return (char *)(r+1);
}